

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O1

void crnlib::console::add_console_output_func(console_output_func pFunc,void *pData)

{
  long lVar1;
  mutex *this;
  ulong uVar2;
  
  init((EVP_PKEY_CTX *)pFunc);
  this = m_pMutex;
  mutex::lock(m_pMutex);
  if (DAT_001cf9dc <= DAT_001cf9d8) {
    elemental_vector::increase_capacity
              ((elemental_vector *)&m_output_funcs,DAT_001cf9d8 + 1,true,0x10,
               vector<crnlib::console::console_func>::object_mover,false);
  }
  lVar1 = m_output_funcs;
  uVar2 = (ulong)DAT_001cf9d8;
  DAT_001cf9d8 = DAT_001cf9d8 + 1;
  *(console_output_func *)(m_output_funcs + uVar2 * 0x10) = pFunc;
  *(void **)(lVar1 + 8 + uVar2 * 0x10) = pData;
  mutex::unlock(this);
  return;
}

Assistant:

void console::add_console_output_func(console_output_func pFunc, void* pData)
    {
        init();

        scoped_mutex lock(*m_pMutex);

        m_output_funcs.push_back(console_func(pFunc, pData));
    }